

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QStringView,QXmlStreamReaderPrivate::Entity>::emplace<QXmlStreamReaderPrivate::Entity_const&>
          (QHash<QStringView,QXmlStreamReaderPrivate::Entity> *this,QStringView *key,Entity *args)

{
  Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  Entity local_58;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> **)this;
  if (pDVar1 == (Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> *)0x0) {
    local_58.name.d.d = (Data *)0x0;
LAB_0039d739:
    pDVar1 = (Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> *)0x0;
LAB_0039d75a:
    pDVar1 = QHashPrivate::Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_>::
             detached(pDVar1);
    *(Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> **)this = pDVar1;
LAB_0039d762:
    pVar2 = (piter)emplace_helper<QXmlStreamReaderPrivate::Entity_const&>(this,key,args);
    QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::~QHash
              ((QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *)&local_58);
  }
  else {
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      local_58.name.d.d = (Data *)pDVar1;
      if ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pDVar1 = *(Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> **)this;
        if (pDVar1 == (Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> *)0x0
           ) goto LAB_0039d739;
      }
      if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) goto LAB_0039d75a;
      goto LAB_0039d762;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar2 = (piter)emplace_helper<QXmlStreamReaderPrivate::Entity_const&>(this,key,args);
        return (iterator)pVar2;
      }
      goto LAB_0039d88a;
    }
    local_58.name.d.d = (args->name).d.d;
    local_58.name.d.ptr = (args->name).d.ptr;
    local_58.name.d.size = (args->name).d.size;
    if ((Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> *)local_58.name.d.d
        != (Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> *)0x0) {
      LOCK();
      (((QArrayData *)
       &((Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> *)
        local_58.name.d.d)->ref)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)
            &((Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> *)
             local_58.name.d.d)->ref)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_58.value.d.d = (args->value).d.d;
    local_58.value.d.ptr = (args->value).d.ptr;
    local_58.value.d.size = (args->value).d.size;
    if (&(local_58.value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_58.value.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_58.value.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_58._48_1_ = args->field_0x30;
    pVar2 = (piter)QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::
                   emplace_helper<QXmlStreamReaderPrivate::Entity>
                             ((QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *)this,key,
                              &local_58);
    if (&(local_58.value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_58.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_58.value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> *)local_58.name.d.d
        != (Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> *)0x0) {
      LOCK();
      (((RefCount *)&(local_58.name.d.d)->super_QArrayData)->atomic)._q_value.
      super___atomic_base<int>._M_i =
           (((RefCount *)&(local_58.name.d.d)->super_QArrayData)->atomic)._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((RefCount *)&(local_58.name.d.d)->super_QArrayData)->atomic)._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.name.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
LAB_0039d88a:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }